

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O2

bool __thiscall
CppJieba::MixSegment::cut
          (MixSegment *this,const_iterator begin,const_iterator end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  value_type_conflict *__x;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  allocator local_d9;
  Unicode unico;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  hmmRes;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> infos;
  string local_78;
  string tmp;
  
  if ((this->super_SegmentBase)._isInited == false) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                  ,0x3c,
                  "virtual bool CppJieba::MixSegment::cut(Unicode::const_iterator, Unicode::const_iterator, vector<string> &) const"
                 );
  }
  if (begin._M_current == end._M_current) {
    bVar1 = false;
  }
  else {
    infos.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    infos.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    infos.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = MPSegment::cut(&this->_mpSeg,begin,end,&infos);
    if (bVar1) {
      unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      hmmRes.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      tmp._M_string_length = 0;
      unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      hmmRes.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      hmmRes.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tmp.field_2._M_local_buf[0] = '\0';
      uVar3 = 0;
      while( true ) {
        uVar4 = (ulong)uVar3;
        if ((ulong)(((long)infos.
                           super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)infos.
                          super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar4) break;
        TransCode::encode(&infos.
                           super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4].word,&tmp);
        __x = infos.
              super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar4].word.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
        if ((long)infos.
                  super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar4].word.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)__x == 2) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(&unico,__x);
        }
        else {
          if (unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start !=
              unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::
            vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            ::clear(&hmmRes);
            bVar1 = HMMSegment::cut(&this->_hmmSeg,
                                    (const_iterator)
                                    unico.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (const_iterator)
                                    unico.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,&hmmRes);
            if (!bVar1) {
              std::__cxx11::string::string((string *)&local_78,"_hmmSeg cut failed.",&local_d9);
              Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x58,&local_78);
              goto LAB_00114767;
            }
            uVar5 = 0;
            while( true ) {
              if ((ulong)(((long)hmmRes.
                                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)hmmRes.
                                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= (ulong)uVar5)
              break;
              TransCode::encode(hmmRes.
                                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar5,&tmp);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(res,&tmp);
              uVar5 = uVar5 + 1;
            }
            if (unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start) {
              unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                   .super__Vector_impl_data._M_start;
            }
          }
          TransCode::encode(&infos.
                             super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4].word,&tmp);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(res,&tmp);
        }
        uVar3 = uVar3 + 1;
      }
      bVar1 = true;
      if (unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start !=
          unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::
        vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
        ::clear(&hmmRes);
        bVar2 = HMMSegment::cut(&this->_hmmSeg,
                                (const_iterator)
                                unico.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (const_iterator)
                                unico.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_finish,&hmmRes);
        if (bVar2) {
          uVar3 = 0;
          while( true ) {
            if ((ulong)(((long)hmmRes.
                               super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)hmmRes.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= (ulong)uVar3)
            break;
            TransCode::encode(hmmRes.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar3,&tmp);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(res,&tmp);
            uVar3 = uVar3 + 1;
          }
        }
        else {
          std::__cxx11::string::string((string *)&local_78,"_hmmSeg cut failed.",&local_d9);
          Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x6b,&local_78);
LAB_00114767:
          std::__cxx11::string::~string((string *)&local_78);
          bVar1 = false;
        }
      }
      std::__cxx11::string::~string((string *)&tmp);
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::~vector(&hmmRes);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    }
    else {
      std::__cxx11::string::string((string *)&tmp,"mpSeg cutDAG failed.",(allocator *)&local_78);
      Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x44,&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      bVar1 = false;
    }
    std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::~vector(&infos);
  }
  return bVar1;
}

Assistant:

virtual bool cut(Unicode::const_iterator begin, Unicode::const_iterator end, vector<string>& res)const
            {
				assert(_getInitFlag());
                if(begin == end)
                {
                    return false;
                }
                vector<TrieNodeInfo> infos;
                if(!_mpSeg.cut(begin, end, infos))
                {
                    LogError("mpSeg cutDAG failed.");
                    return false;
                }
                Unicode unico;
                vector<Unicode> hmmRes;
                string tmp;
                for(uint i= 0; i < infos.size(); i++)
                {
                    TransCode::encode(infos[i].word,tmp);
                    if(1 == infos[i].word.size())
                    {
                        unico.push_back(infos[i].word[0]);
                    }
                    else
                    {
                        if(!unico.empty())
                        {
                            hmmRes.clear();
                            if(!_hmmSeg.cut(unico.begin(), unico.end(), hmmRes))
                            {
                                LogError("_hmmSeg cut failed.");
                                return false;
                            }
                            for(uint j = 0; j < hmmRes.size(); j++)
                            {
                                TransCode::encode(hmmRes[j], tmp);
                                res.push_back(tmp);
                            }
                        }
                        unico.clear();
                        TransCode::encode(infos[i].word, tmp);
                        res.push_back(tmp);
                    }
                }
                if(!unico.empty())
                {
                    hmmRes.clear();
                    if(!_hmmSeg.cut(unico.begin(), unico.end(), hmmRes))
                    {
                        LogError("_hmmSeg cut failed.");
                        return false;
                    }
                    for(uint j = 0; j < hmmRes.size(); j++)
                    {
                        TransCode::encode(hmmRes[j], tmp);
                        res.push_back(tmp);
                    }
                }

                return true;
            }